

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O3

void addrinfo_sort_list(addrinfo **ailist,_func_int_addrinfo_ptr_addrinfo_ptr *compare)

{
  addrinfo *paVar1;
  int iVar2;
  addrinfo *paVar3;
  addrinfo *paVar4;
  addrinfo *paVar5;
  addrinfo *temp;
  addrinfo *paVar6;
  addrinfo *paVar7;
  
  if (*ailist == (addrinfo *)0x0) {
    paVar3 = (addrinfo *)0x0;
  }
  else {
    paVar5 = *ailist;
    paVar7 = (addrinfo *)0x0;
    do {
      paVar1 = paVar5->ai_next;
      paVar3 = paVar5;
      if (paVar7 == (addrinfo *)0x0) {
        paVar6 = (addrinfo *)0x0;
      }
      else {
        iVar2 = (*compare)(paVar5,paVar7);
        paVar6 = paVar7;
        if (iVar2 < 0) {
          paVar4 = (addrinfo *)0x0;
        }
        else {
          do {
            paVar4 = paVar6;
            paVar6 = paVar4->ai_next;
            if (paVar6 == (addrinfo *)0x0) {
              paVar6 = (addrinfo *)0x0;
              goto LAB_0017688d;
            }
            iVar2 = (*compare)(paVar5,paVar6);
          } while (-1 < iVar2);
        }
        if (paVar4 != (addrinfo *)0x0) {
LAB_0017688d:
          paVar4->ai_next = paVar5;
          paVar3 = paVar7;
        }
      }
      paVar5->ai_next = paVar6;
      paVar5 = paVar1;
      paVar7 = paVar3;
    } while (paVar1 != (addrinfo *)0x0);
  }
  *ailist = paVar3;
  return;
}

Assistant:

void addrinfo_sort_list(struct addrinfo **ailist,
    int (*compare)(const struct addrinfo*, const struct addrinfo*))
{
    struct addrinfo *result = NULL, *ai = (*ailist);
    while (ai)
    {
        struct addrinfo *temp = ai;
        ai = ai->ai_next;
        if (result)
        {
            struct addrinfo *ai2 = result, *last = NULL;
            while (ai2 && (compare(temp, ai2) >= 0))
            {
                last = ai2;
                ai2 = ai2->ai_next;
            }
            if (last)
            {
                last->ai_next = temp;
                temp->ai_next = ai2;
            }
            else
            {
                result = temp;
                temp->ai_next = ai2;
            }
        }
        else
        {
            result = temp;
            temp->ai_next = NULL;
        }
    }
    *ailist = result;
}